

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O2

string * __thiscall
transwarp::to_string_abi_cxx11_(string *__return_storage_ptr__,transwarp *this,task_type *type)

{
  invalid_parameter *this_00;
  char *pcVar1;
  allocator local_39;
  string local_38;
  
  switch(*(undefined4 *)this) {
  case 0:
    pcVar1 = "root";
    break;
  case 1:
    pcVar1 = "accept";
    break;
  case 2:
    pcVar1 = "accept_any";
    break;
  case 3:
    pcVar1 = "consume";
    break;
  case 4:
    pcVar1 = "consume_any";
    break;
  case 5:
    pcVar1 = "wait";
    break;
  case 6:
    pcVar1 = "wait_any";
    break;
  default:
    this_00 = (invalid_parameter *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_38,"task type",&local_39);
    invalid_parameter::invalid_parameter(this_00,&local_38);
    __cxa_throw(this_00,&invalid_parameter::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string(const transwarp::task_type& type) {
    switch (type) {
    case transwarp::task_type::root: return "root";
    case transwarp::task_type::accept: return "accept";
    case transwarp::task_type::accept_any: return "accept_any";
    case transwarp::task_type::consume: return "consume";
    case transwarp::task_type::consume_any: return "consume_any";
    case transwarp::task_type::wait: return "wait";
    case transwarp::task_type::wait_any: return "wait_any";
    default: throw transwarp::invalid_parameter("task type");
    }
}